

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktFragmentOperationsEarlyFragmentTests.cpp
# Opt level: O0

void __thiscall
vkt::FragmentOperations::anon_unknown_1::EarlyFragmentTestInstance::EarlyFragmentTestInstance
          (EarlyFragmentTestInstance *this,Context *context,deUint32 flags)

{
  TestMode local_34;
  deUint32 flags_local;
  Context *context_local;
  EarlyFragmentTestInstance *this_local;
  
  TestInstance::TestInstance(&this->super_TestInstance,context);
  (this->super_TestInstance)._vptr_TestInstance =
       (_func_int **)&PTR__EarlyFragmentTestInstance_016b3e28;
  if ((flags & 1) == 0) {
    local_34 = MODE_INVALID;
    if ((flags & 2) != 0) {
      local_34 = MODE_STENCIL;
    }
  }
  else {
    local_34 = MODE_DEPTH;
  }
  this->m_testMode = local_34;
  this->m_useTestAttachment = (flags & 4) == 0;
  this->m_useEarlyTests = (flags & 8) == 0;
  return;
}

Assistant:

EarlyFragmentTestInstance::EarlyFragmentTestInstance (Context& context, const deUint32 flags)
	: TestInstance			(context)
	, m_testMode			(flags & FLAG_TEST_DEPTH   ? MODE_DEPTH :
							 flags & FLAG_TEST_STENCIL ? MODE_STENCIL : MODE_INVALID)
	, m_useTestAttachment	((flags & FLAG_DONT_USE_TEST_ATTACHMENT) == 0)
	, m_useEarlyTests		((flags & FLAG_DONT_USE_EARLY_FRAGMENT_TESTS) == 0)
{
	DE_ASSERT(m_testMode != MODE_INVALID);
}